

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O2

void diy::mpi::detail::scan
               (communicator *comm,void *dataIn,void *dataOut,int count,datatype *type,operation *op
               )

{
  MPI_Scan(dataIn,dataOut,count,(type->handle).data,(op->handle).data,(comm->comm_).data);
  return;
}

Assistant:

void scan(const communicator& comm,
          const void* dataIn, void* dataOut, int count, const datatype& type,
          const operation& op)
{
#if DIY_HAS_MPI
  MPI_Scan(dataIn, dataOut, count, mpi_cast(type.handle), mpi_cast(op.handle), mpi_cast(comm.handle()));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), count);
  (void)comm; (void)op;
#endif
}